

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_of_source_main.cpp
# Opt level: O0

string * getTemplateString_abi_cxx11_(void)

{
  string *in_RDI;
  string rootDir;
  string args;
  string *templateString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "{ApprovalsSubdirectory}/{TestFileName}.{TestCaseName}.{ApprovedOrReceived}.{FileExtension}"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  getApprovedFilesLocation_abi_cxx11_();
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string getTemplateString()
{
    std::string args =
        "{ApprovalsSubdirectory}/"
        "{TestFileName}.{TestCaseName}.{ApprovedOrReceived}.{FileExtension}";

    std::string rootDir = getApprovedFilesLocation();
    std::string templateString = rootDir + args;
    return templateString;
}